

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

HandlePtr __thiscall
dg::vr::ValueRelations::getAndMerge(ValueRelations *this,ValueRelations *other,Handle otherH)

{
  pointer ppVVar1;
  VectorSet<const_llvm::Value_*> *otherEqual;
  HandlePtr b;
  size_t id;
  pointer ppVVar2;
  
  otherEqual = getEqual(other,otherH);
  b = getCorresponding(this,other,otherH,otherEqual);
  if (b != (HandlePtr)0x0) {
    id = RelationsGraph<dg::vr::ValueRelations>::getBorderId(&other->graph,otherH);
    if (id != 0xffffffffffffffff) {
      RelationsGraph<dg::vr::ValueRelations>::makeBorderBucket(&this->graph,b,id);
    }
    ppVVar1 = (otherEqual->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar2 = (otherEqual->vec).
                   super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVVar2 != ppVVar1;
        ppVVar2 = ppVVar2 + 1) {
      add(this,*ppVVar2,b);
    }
  }
  return b;
}

Assistant:

ValueRelations::HandlePtr
ValueRelations::getAndMerge(const ValueRelations &other, Handle otherH) {
    const VectorSet<V> &otherEqual = other.getEqual(otherH);
    HandlePtr thisH = getCorresponding(other, otherH, otherEqual);

    if (!thisH)
        return nullptr;

    size_t borderId = other.getBorderId(otherH);
    if (borderId != std::string::npos)
        graph.makeBorderBucket(*thisH, borderId);

    for (V val : otherEqual)
        add(val, *thisH);

    return thisH;
}